

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# r_bsp.cpp
# Opt level: O0

void R_AddLine(seg_t *line)

{
  line_t *line_00;
  line_t *portal;
  bool bVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  uint uVar5;
  bool local_11a;
  bool local_119;
  bool local_105;
  FTextureID local_104;
  FTextureID local_100;
  FTextureID local_fc;
  FTextureID local_f8;
  FTextureID local_f4;
  FTextureID local_f0;
  FTextureID local_ec;
  FTextureID local_e8;
  FTextureID local_e4;
  undefined1 local_e0 [32];
  undefined1 local_c0 [32];
  vertex_t *local_a0;
  vertex_t *v2;
  vertex_t *v1;
  undefined1 local_80 [32];
  undefined1 local_60 [32];
  undefined1 local_40 [8];
  DVector2 pt2;
  DVector2 pt1;
  bool solid;
  seg_t *line_local;
  
  if ((R_AddLine(seg_t*)::tempsec == '\0') &&
     (iVar3 = __cxa_guard_acquire(&R_AddLine(seg_t*)::tempsec), iVar3 != 0)) {
    sector_t::sector_t(&R_AddLine::tempsec);
    __cxa_guard_release(&R_AddLine(seg_t*)::tempsec);
  }
  TVector2<double>::TVector2((TVector2<double> *)&pt2.Y);
  TVector2<double>::TVector2((TVector2<double> *)local_40);
  dc_color = (int)(((long)line - (long)segs) / 0x48) * 8 + 4U & 0xff;
  curline = line;
  vertex_t::fPos((vertex_t *)local_60);
  operator-((TVector2<double> *)(local_60 + 0x10),(TVector3<double> *)local_60);
  TVector2<double>::operator=((TVector2<double> *)&pt2.Y,(TVector2<double> *)(local_60 + 0x10));
  vertex_t::fPos((vertex_t *)local_80);
  operator-((TVector2<double> *)(local_80 + 0x10),(TVector3<double> *)local_80);
  TVector2<double>::operator=((TVector2<double> *)local_40,(TVector2<double> *)(local_80 + 0x10));
  if (0.0 <= pt1.X * (pt2.Y - (double)local_40) + pt2.Y * (pt2.X - pt1.X)) {
    return;
  }
  bVar1 = FWallCoords::Init(&WallC,(DVector2 *)&pt2.Y,(DVector2 *)local_40,0.0078125);
  if (bVar1) {
    return;
  }
  if (WindowRight <= WallC.sx1) {
    return;
  }
  if (WallC.sx2 <= WindowLeft) {
    return;
  }
  if (line->linedef == (line_t *)0x0) {
    bVar1 = R_CheckClipWallSegment((int)WallC.sx1,(int)WallC.sx2);
    if (!bVar1) {
      return;
    }
    InSubsector->flags = InSubsector->flags | 2;
    return;
  }
  local_105 = false;
  if (((CurrentPortalInSkybox & 1U) == 0) &&
     (local_105 = false, CurrentPortal != (PortalDrawseg *)0x0)) {
    line_00 = line->linedef;
    portal = CurrentPortal->dst;
    TVector2<double>::TVector2((TVector2<double> *)&v1,&ViewPos);
    local_105 = P_ClipLineToPortal(line_00,portal,(DVector2 *)&v1,true,true);
  }
  if (local_105 != false) {
    return;
  }
  v2 = line->linedef->v1;
  local_a0 = line->linedef->v2;
  if (((v2 == line->v1) && (local_a0 == line->v2)) || ((local_a0 == line->v1 && (v2 == line->v2))))
  {
    FWallTmapVals::InitFromWallCoords(&WallT,&WallC);
  }
  else {
    if (line->linedef->sidedef[0] != line->sidedef) {
      swapvalues<vertex_t*>(&v2,&local_a0);
    }
    vertex_t::fPos((vertex_t *)local_c0);
    operator-((TVector2<double> *)(local_c0 + 0x10),(TVector3<double> *)local_c0);
    vertex_t::fPos((vertex_t *)local_e0);
    operator-((TVector2<double> *)(local_e0 + 0x10),(TVector3<double> *)local_e0);
    FWallTmapVals::InitFromLine(&WallT,(DVector2 *)(local_c0 + 0x10),(DVector2 *)(local_e0 + 0x10));
  }
  if ((fake3D & 4U) == 0) {
    backsector = line->backsector;
  }
  rw_frontcz1 = secplane_t::ZatPoint(&frontsector->ceilingplane,line->v1);
  rw_frontfz1 = secplane_t::ZatPoint(&frontsector->floorplane,line->v1);
  rw_frontcz2 = secplane_t::ZatPoint(&frontsector->ceilingplane,line->v2);
  rw_frontfz2 = secplane_t::ZatPoint(&frontsector->floorplane,line->v2);
  rw_mustmarkceiling = false;
  rw_mustmarkfloor = false;
  rw_havelow = false;
  rw_havehigh = false;
  if (backsector == (sector_t *)0x0) {
    pt1.Y._3_1_ = true;
    goto LAB_00383c85;
  }
  if ((fake3D & 4U) == 0) {
    backsector = R_FakeFlat(backsector,&R_AddLine::tempsec,(int *)0x0,(int *)0x0,true);
  }
  doorclosed = 0;
  rw_backcz1 = secplane_t::ZatPoint(&backsector->ceilingplane,line->v1);
  rw_backfz1 = secplane_t::ZatPoint(&backsector->floorplane,line->v1);
  rw_backcz2 = secplane_t::ZatPoint(&backsector->ceilingplane,line->v2);
  rw_backfz2 = secplane_t::ZatPoint(&backsector->floorplane,line->v2);
  if ((fake3D & 4U) != 0) {
    if ((rw_backfz1 <= rw_frontfz1) && (rw_backfz2 <= rw_frontfz2)) {
      fake3D = fake3D | 8;
    }
    if ((rw_frontcz1 <= rw_backcz1) && (rw_frontcz2 <= rw_backcz2)) {
      fake3D = fake3D | 0x10;
    }
  }
  if ((rw_backcz1 < rw_frontcz1) || (rw_backcz2 < rw_frontcz2)) {
    rw_havehigh = true;
    WallMost(wallupper,&backsector->ceilingplane,&WallC);
  }
  if ((rw_frontfz1 < rw_backfz1) || (rw_frontfz2 < rw_backfz2)) {
    rw_havelow = true;
    WallMost(walllower,&backsector->floorplane,&WallC);
  }
  bVar1 = line_t::isVisualPortal(line->linedef);
  if ((bVar1) && (line->sidedef == line->linedef->sidedef[0])) {
    pt1.Y._3_1_ = true;
    goto LAB_00383c85;
  }
  if (((rw_backcz1 <= rw_frontfz1) && (rw_backcz2 <= rw_frontfz2)) ||
     ((rw_frontcz1 <= rw_backfz1 && (rw_frontcz2 <= rw_backfz2)))) {
    pt1.Y._3_1_ = true;
    goto LAB_00383c85;
  }
  local_e4 = sector_t::GetTexture(backsector,1);
  bVar1 = FTextureID::operator!=(&local_e4,&skyflatnum);
  if (bVar1) {
LAB_0038377e:
    local_119 = false;
    if ((rw_backcz1 <= rw_backfz1) && (local_119 = false, rw_backcz2 <= rw_backfz2)) {
      if ((rw_backcz1 < rw_frontcz1) || (rw_backcz2 < rw_frontcz2)) {
        local_ec = side_t::GetTexture(line->sidedef,0);
        bVar1 = FTextureID::isValid(&local_ec);
        local_119 = false;
        if (!bVar1) goto LAB_00383882;
      }
      if ((rw_frontfz1 < rw_backfz1) || (local_11a = true, rw_frontfz2 < rw_backfz2)) {
        local_f0 = side_t::GetTexture(line->sidedef,2);
        local_11a = FTextureID::isValid(&local_f0);
      }
      local_119 = local_11a;
    }
  }
  else {
    local_e8 = sector_t::GetTexture(frontsector,1);
    bVar1 = FTextureID::operator!=(&local_e8,&skyflatnum);
    local_119 = false;
    if (bVar1) goto LAB_0038377e;
  }
LAB_00383882:
  if (local_119 != false) {
    doorclosed = 1;
    pt1.Y._3_1_ = true;
    goto LAB_00383c85;
  }
  bVar1 = secplane_t::operator!=(&frontsector->ceilingplane,&backsector->ceilingplane);
  if (((!bVar1) &&
      (bVar1 = secplane_t::operator!=(&frontsector->floorplane,&backsector->floorplane), !bVar1)) &&
     (bVar1 = R_SkyboxCompare(frontsector,backsector), !bVar1)) {
    bVar1 = true;
    if (backsector->lightlevel == frontsector->lightlevel) {
      local_f4 = sector_t::GetTexture(backsector,0);
      local_f8 = sector_t::GetTexture(frontsector,0);
      bVar2 = FTextureID::operator!=(&local_f4,&local_f8);
      bVar1 = true;
      if (!bVar2) {
        local_fc = sector_t::GetTexture(backsector,1);
        local_100 = sector_t::GetTexture(frontsector,1);
        bVar2 = FTextureID::operator!=(&local_fc,&local_100);
        bVar1 = true;
        if (!bVar2) {
          local_104 = side_t::GetTexture(curline->sidedef,1);
          bVar2 = FTextureID::isValid(&local_104);
          bVar1 = true;
          if (!bVar2) {
            bVar2 = FTransform::operator!=((FTransform *)backsector,(FTransform *)frontsector);
            bVar1 = true;
            if (!bVar2) {
              bVar2 = FTransform::operator!=
                                (&backsector->planes[1].xform,&frontsector->planes[1].xform);
              bVar1 = true;
              if (!bVar2) {
                iVar3 = sector_t::GetPlaneLight(backsector,0);
                iVar4 = sector_t::GetPlaneLight(frontsector,0);
                bVar1 = true;
                if (iVar3 == iVar4) {
                  iVar3 = sector_t::GetPlaneLight(backsector,1);
                  iVar4 = sector_t::GetPlaneLight(frontsector,1);
                  bVar1 = true;
                  if (iVar3 == iVar4) {
                    iVar3 = sector_t::GetVisFlags(backsector,0);
                    iVar4 = sector_t::GetVisFlags(frontsector,0);
                    bVar1 = true;
                    if (iVar3 == iVar4) {
                      iVar3 = sector_t::GetVisFlags(backsector,1);
                      iVar4 = sector_t::GetVisFlags(frontsector,1);
                      bVar1 = true;
                      if ((iVar3 == iVar4) &&
                         (bVar1 = true, backsector->ColorMap == frontsector->ColorMap)) {
                        if (frontsector->e != (extsector_t *)0x0) {
                          uVar5 = TArray<lightlist_t,_lightlist_t>::Size
                                            (&(frontsector->e->XFloor).lightlist);
                          bVar1 = true;
                          if (uVar5 != 0) goto LAB_00383c19;
                        }
                        bVar1 = false;
                        if (backsector->e != (extsector_t *)0x0) {
                          uVar5 = TArray<lightlist_t,_lightlist_t>::Size
                                            (&(backsector->e->XFloor).lightlist);
                          bVar1 = uVar5 != 0;
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
LAB_00383c19:
    if (!bVar1) {
      if ((hasglnodes & 1U) == 0) {
        return;
      }
      if ((InSubsector->flags & 2U) != 0) {
        return;
      }
      bVar1 = R_CheckClipWallSegment((int)WallC.sx1,(int)WallC.sx2);
      if (!bVar1) {
        return;
      }
      InSubsector->flags = InSubsector->flags | 2;
      return;
    }
  }
  pt1.Y._3_1_ = false;
LAB_00383c85:
  rw_prepped = false;
  if (line->linedef->special == 9) {
    clearbufshort(walltop + (int)WallC.sx1,(int)WallC.sx2 - (int)WallC.sx1,(WORD)centery);
    clearbufshort(wallbottom + (int)WallC.sx1,(int)WallC.sx2 - (int)WallC.sx1,(WORD)centery);
  }
  else {
    rw_ceilstat = WallMost(walltop,&frontsector->ceilingplane,&WallC);
    rw_floorstat = WallMost(wallbottom,&frontsector->floorplane,&WallC);
  }
  bVar1 = R_ClipWallSegment((int)WallC.sx1,(int)WallC.sx2,pt1.Y._3_1_);
  if (bVar1) {
    InSubsector->flags = InSubsector->flags | 2;
  }
  return;
}

Assistant:

void R_AddLine (seg_t *line)
{
	static sector_t tempsec;	// killough 3/8/98: ceiling/water hack
	bool			solid;
	DVector2		pt1, pt2;

	curline = line;

	// [RH] Color if not texturing line
	dc_color = (((int)(line - segs) * 8) + 4) & 255;

	pt1 = line->v1->fPos() - ViewPos;
	pt2 = line->v2->fPos() - ViewPos;

	// Reject lines not facing viewer
	if (pt1.Y * (pt1.X - pt2.X) + pt1.X * (pt2.Y - pt1.Y) >= 0)
		return;

	if (WallC.Init(pt1, pt2, 32.0 / (1 << 12)))
		return;

	if (WallC.sx1 >= WindowRight || WallC.sx2 <= WindowLeft)
		return;

	if (line->linedef == NULL)
	{
		if (R_CheckClipWallSegment (WallC.sx1, WallC.sx2))
		{
			InSubsector->flags |= SSECF_DRAWN;
		}
		return;
	}

	// reject lines that aren't seen from the portal (if any)
	// [ZZ] 10.01.2016: lines inside a skybox shouldn't be clipped, although this imposes some limitations on portals in skyboxes.
	if (!CurrentPortalInSkybox && CurrentPortal && P_ClipLineToPortal(line->linedef, CurrentPortal->dst, ViewPos))
		return;

	vertex_t *v1, *v2;
	v1 = line->linedef->v1;
	v2 = line->linedef->v2;

	if ((v1 == line->v1 && v2 == line->v2) || (v2 == line->v1 && v1 == line->v2))
	{ // The seg is the entire wall.
		WallT.InitFromWallCoords(&WallC);
	}
	else
	{ // The seg is only part of the wall.
		if (line->linedef->sidedef[0] != line->sidedef)
		{
			swapvalues (v1, v2);
		}
		WallT.InitFromLine(v1->fPos() - ViewPos, v2->fPos() - ViewPos);
	}

	if (!(fake3D & FAKE3D_FAKEBACK))
	{
		backsector = line->backsector;
	}
	rw_frontcz1 = frontsector->ceilingplane.ZatPoint(line->v1);
	rw_frontfz1 = frontsector->floorplane.ZatPoint(line->v1);
	rw_frontcz2 = frontsector->ceilingplane.ZatPoint(line->v2);
	rw_frontfz2 = frontsector->floorplane.ZatPoint(line->v2);

	rw_mustmarkfloor = rw_mustmarkceiling = false;
	rw_havehigh = rw_havelow = false;

	// Single sided line?
	if (backsector == NULL)
	{
		solid = true;
	}
	else
	{
		// kg3D - its fake, no transfer_heights
		if (!(fake3D & FAKE3D_FAKEBACK))
		{ // killough 3/8/98, 4/4/98: hack for invisible ceilings / deep water
			backsector = R_FakeFlat (backsector, &tempsec, NULL, NULL, true);
		}
		doorclosed = 0;		// killough 4/16/98

		rw_backcz1 = backsector->ceilingplane.ZatPoint(line->v1);
		rw_backfz1 = backsector->floorplane.ZatPoint(line->v1);
		rw_backcz2 = backsector->ceilingplane.ZatPoint(line->v2);
		rw_backfz2 = backsector->floorplane.ZatPoint(line->v2);

		if (fake3D & FAKE3D_FAKEBACK)
		{
			if (rw_frontfz1 >= rw_backfz1 && rw_frontfz2 >= rw_backfz2)
			{
				fake3D |= FAKE3D_CLIPBOTFRONT;
			}
			if (rw_frontcz1 <= rw_backcz1 && rw_frontcz2 <= rw_backcz2)
			{
				fake3D |= FAKE3D_CLIPTOPFRONT;
			}
		}

		// Cannot make these walls solid, because it can result in
		// sprite clipping problems for sprites near the wall
		if (rw_frontcz1 > rw_backcz1 || rw_frontcz2 > rw_backcz2)
		{
			rw_havehigh = true;
			WallMost (wallupper, backsector->ceilingplane, &WallC);
		}
		if (rw_frontfz1 < rw_backfz1 || rw_frontfz2 < rw_backfz2)
		{
			rw_havelow = true;
			WallMost (walllower, backsector->floorplane, &WallC);
		}

		// Portal
		if (line->linedef->isVisualPortal() && line->sidedef == line->linedef->sidedef[0])
		{
			solid = true;
		}
		// Closed door.
		else if ((rw_backcz1 <= rw_frontfz1 && rw_backcz2 <= rw_frontfz2) ||
				 (rw_backfz1 >= rw_frontcz1 && rw_backfz2 >= rw_frontcz2))
		{
			solid = true;
		}
		else if (
		// properly render skies (consider door "open" if both ceilings are sky):
		(backsector->GetTexture(sector_t::ceiling) != skyflatnum || frontsector->GetTexture(sector_t::ceiling) != skyflatnum)

		// if door is closed because back is shut:
		&& rw_backcz1 <= rw_backfz1 && rw_backcz2 <= rw_backfz2

		// preserve a kind of transparent door/lift special effect:
		&& ((rw_backcz1 >= rw_frontcz1 && rw_backcz2 >= rw_frontcz2) || line->sidedef->GetTexture(side_t::top).isValid())
		&& ((rw_backfz1 <= rw_frontfz1 && rw_backfz2 <= rw_frontfz2) || line->sidedef->GetTexture(side_t::bottom).isValid()))
		{
		// killough 1/18/98 -- This function is used to fix the automap bug which
		// showed lines behind closed doors simply because the door had a dropoff.
		//
		// It assumes that Doom has already ruled out a door being closed because
		// of front-back closure (e.g. front floor is taller than back ceiling).

		// This fixes the automap floor height bug -- killough 1/18/98:
		// killough 4/7/98: optimize: save result in doorclosed for use in r_segs.c
			doorclosed = true;
			solid = true;
		}
		else if (frontsector->ceilingplane != backsector->ceilingplane ||
			frontsector->floorplane != backsector->floorplane)
		{
		// Window.
			solid = false;
		}
		else if (R_SkyboxCompare(frontsector, backsector))
		{
			solid = false;
		}
		else if (backsector->lightlevel != frontsector->lightlevel
			|| backsector->GetTexture(sector_t::floor) != frontsector->GetTexture(sector_t::floor)
			|| backsector->GetTexture(sector_t::ceiling) != frontsector->GetTexture(sector_t::ceiling)
			|| curline->sidedef->GetTexture(side_t::mid).isValid()

			// killough 3/7/98: Take flats offsets into account:
			|| backsector->planes[sector_t::floor].xform != frontsector->planes[sector_t::floor].xform
			|| backsector->planes[sector_t::ceiling].xform != frontsector->planes[sector_t::ceiling].xform

			|| backsector->GetPlaneLight(sector_t::floor) != frontsector->GetPlaneLight(sector_t::floor)
			|| backsector->GetPlaneLight(sector_t::ceiling) != frontsector->GetPlaneLight(sector_t::ceiling)
			|| backsector->GetVisFlags(sector_t::floor) != frontsector->GetVisFlags(sector_t::floor)
			|| backsector->GetVisFlags(sector_t::ceiling) != frontsector->GetVisFlags(sector_t::ceiling)

			// [RH] Also consider colormaps
			|| backsector->ColorMap != frontsector->ColorMap



			// kg3D - and fake lights
			|| (frontsector->e && frontsector->e->XFloor.lightlist.Size())
			|| (backsector->e && backsector->e->XFloor.lightlist.Size())
			)
		{
			solid = false;
		}
		else
		{
			// Reject empty lines used for triggers and special events.
			// Identical floor and ceiling on both sides, identical light levels
			// on both sides, and no middle texture.

			// When using GL nodes, do a clipping test for these lines so we can
			// mark their subsectors as visible for automap texturing.
			if (hasglnodes && !(InSubsector->flags & SSECF_DRAWN))
			{
				if (R_CheckClipWallSegment(WallC.sx1, WallC.sx2))
				{
					InSubsector->flags |= SSECF_DRAWN;
				}
			}
			return;
		}
	}

	rw_prepped = false;

	if (line->linedef->special == Line_Horizon)
	{
		// Be aware: Line_Horizon does not work properly with sloped planes
		clearbufshort (walltop+WallC.sx1, WallC.sx2 - WallC.sx1, centery);
		clearbufshort (wallbottom+WallC.sx1, WallC.sx2 - WallC.sx1, centery);
	}
	else
	{
		rw_ceilstat = WallMost (walltop, frontsector->ceilingplane, &WallC);
		rw_floorstat = WallMost (wallbottom, frontsector->floorplane, &WallC);

		// [RH] treat off-screen walls as solid
#if 0	// Maybe later...
		if (!solid)
		{
			if (rw_ceilstat == 12 && line->sidedef->GetTexture(side_t::top) != 0)
			{
				rw_mustmarkceiling = true;
				solid = true;
			}
			if (rw_floorstat == 3 && line->sidedef->GetTexture(side_t::bottom) != 0)
			{
				rw_mustmarkfloor = true;
				solid = true;
			}
		}
#endif
	}

	if (R_ClipWallSegment (WallC.sx1, WallC.sx2, solid))
	{
		InSubsector->flags |= SSECF_DRAWN;
	}
}